

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::define(Options *this,string *aDefinition)

{
  Option_register *aDefinition_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  Option_register *this_00;
  size_type sVar6;
  ulong uVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  undefined1 local_188 [44];
  uint i;
  string optionName;
  int definitionIndex;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pointer local_128;
  pointer local_120;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_108 [40];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [8];
  string ovalue;
  string local_98 [8];
  string otype;
  string local_68 [8];
  string rest;
  string local_48 [8];
  string aliases;
  size_type location;
  Option_register *definitionEntry;
  string *aDefinition_local;
  Options *this_local;
  
  location = 0;
  definitionEntry = (Option_register *)aDefinition;
  aDefinition_local = (string *)this;
  lVar3 = std::__cxx11::string::find((char *)aDefinition,0x14d1a5);
  if (lVar3 == -1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: no \"=\" in option definition: ");
    poVar4 = std::operator<<(poVar4,(string *)definitionEntry);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)definitionEntry);
  std::__cxx11::string::substr((ulong)local_68,(ulong)definitionEntry);
  std::__cxx11::string::string(local_98,local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  lVar3 = std::__cxx11::string::find((char *)local_68,0x14d234);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_e0,(ulong)local_68);
    std::__cxx11::string::operator=(local_98,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::substr((ulong)(local_108 + 8),(ulong)local_68);
    std::__cxx11::string::operator=(local_b8,(string *)(local_108 + 8));
    std::__cxx11::string::~string((string *)(local_108 + 8));
  }
  local_118._M_current = (char *)std::__cxx11::string::begin();
  local_120 = (pointer)std::__cxx11::string::end();
  local_110 = std::remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                        (local_118,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_120,isspace);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_108,&local_110);
  local_130._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_128,&local_130);
  std::__cxx11::string::erase(local_98,local_108._0_8_,local_128);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 1) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
    if ((((*pcVar5 != 's') &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98), *pcVar5 != 'i')) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98), *pcVar5 != 'f')) &&
       (((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98), *pcVar5 != 'd' &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98), *pcVar5 != 'b')) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98), *pcVar5 != 'c')))) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error: unknown option type \'");
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
      poVar4 = std::operator<<(poVar4,*pcVar5);
      poVar4 = std::operator<<(poVar4,"\' in defintion: ");
      poVar4 = std::operator<<(poVar4,(string *)definitionEntry);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    this_00 = (Option_register *)operator_new(0x88);
    aDefinition_00 = definitionEntry;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
    Option_register::Option_register(this_00,&aDefinition_00->definition,*pcVar5,(string *)local_b8)
    ;
    location = (size_type)this_00;
    sVar6 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::size
                      (&this->m_optionRegister);
    std::__cxx11::string::string((string *)(local_188 + 0x28));
    std::__cxx11::string::operator+=(local_48,'|');
    local_188._36_4_ = 0;
    do {
      uVar7 = (ulong)(uint)local_188._36_4_;
      uVar8 = std::__cxx11::string::size();
      if (uVar8 <= uVar7) {
        std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::push_back
                  (&this->m_optionRegister,(value_type *)&location);
        std::__cxx11::string::~string((string *)(local_188 + 0x28));
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string(local_48);
        return (int)sVar6;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      iVar2 = isspace((int)*pcVar5);
      if (iVar2 == 0) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        if (*pcVar5 == '|') {
          bVar1 = isDefined(this,(string *)(local_188 + 0x28));
          if (bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Option \"");
            poVar4 = std::operator<<(poVar4,(string *)(local_188 + 0x28));
            poVar4 = std::operator<<(poVar4,"\" from definition:");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<((ostream *)&std::cerr,"\t");
            poVar4 = std::operator<<(poVar4,(string *)definitionEntry);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<((ostream *)&std::cerr,"is already defined in: ");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<((ostream *)&std::cerr,"\t");
            getDefinition((Options *)local_188,(string *)this);
            poVar4 = std::operator<<(poVar4,(string *)local_188);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)local_188);
            exit(1);
          }
          lVar3 = std::__cxx11::string::size();
          if (lVar3 != 0) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->m_optionList,(key_type *)(local_188 + 0x28));
            *pmVar9 = (int)sVar6;
          }
          std::__cxx11::string::clear();
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          std::__cxx11::string::operator+=((string *)(local_188 + 0x28),*pcVar5);
        }
      }
      local_188._36_4_ = local_188._36_4_ + 1;
    } while( true );
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Error: option type is invalid: ");
  poVar4 = std::operator<<(poVar4,local_98);
  poVar4 = std::operator<<(poVar4," in option definition: ");
  poVar4 = std::operator<<(poVar4,(string *)definitionEntry);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int Options::define(const std::string& aDefinition) {
   Option_register* definitionEntry = NULL;

   // Error if definition string doesn't contain an equals sign
   auto location = aDefinition.find("=");
   if (location == std::string::npos) {
      std::cerr << "Error: no \"=\" in option definition: " << aDefinition << std::endl;
      exit(1);
   }

   std::string aliases = aDefinition.substr(0, location);
   std::string rest    = aDefinition.substr(location+1);
   std::string otype   = rest;
   std::string ovalue  = "";

   location = rest.find(":");
   if (location != std::string::npos) {
      otype  = rest.substr(0, location);
      ovalue = rest.substr(location+1);
   }

   // Remove anyspaces in the option type field
   otype.erase(remove_if(otype.begin(), otype.end(), ::isspace), otype.end());

   // Option types are only a single charater (b, i, d, c or s)
   if (otype.size() != 1) {
      std::cerr << "Error: option type is invalid: " << otype
           << " in option definition: " << aDefinition << std::endl;
      exit(1);
   }

   // Check to make sure that the type is known
   if (otype[0] != OPTION_STRING_TYPE  &&
       otype[0] != OPTION_INT_TYPE     &&
       otype[0] != OPTION_FLOAT_TYPE   &&
       otype[0] != OPTION_DOUBLE_TYPE  &&
       otype[0] != OPTION_BOOLEAN_TYPE &&
       otype[0] != OPTION_CHAR_TYPE ) {
      std::cerr << "Error: unknown option type \'" << otype[0]
           << "\' in defintion: " << aDefinition << std::endl;
      exit(1);
   }

   // Set up space for a option entry in the registry
   definitionEntry = new Option_register(aDefinition, otype[0], ovalue);

   int definitionIndex = (int)m_optionRegister.size();

   // Store option aliases
   std::string optionName;
   unsigned int i;
   aliases += '|';
   for (i=0; i<aliases.size(); i++) {
      if (::isspace(aliases[i])) {
         continue;
      } else if (aliases[i] == '|') {
         if (isDefined(optionName)) {
            std::cerr << "Option \"" << optionName << "\" from definition:" << std::endl;
            std::cerr << "\t" << aDefinition << std::endl;
            std::cerr << "is already defined in: " << std::endl;
            std::cerr << "\t" << getDefinition(optionName) << std::endl;
            exit(1);
         }
         if (optionName.size() > 0) {
            m_optionList[optionName] = definitionIndex;
         }
         optionName.clear();
      } else {
         optionName += aliases[i];
      }
   }

   // Store definition in registry and return its indexed location.
   // This location will be used to link option aliases to the main
   // command name.
   m_optionRegister.push_back(definitionEntry);
   return definitionIndex;
}